

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

int __thiscall QLCDNumberPrivate::init(QLCDNumberPrivate *this,EVP_PKEY_CTX *ctx)

{
  QLCDNumber *pQVar1;
  long in_FS_OFFSET;
  QLCDNumber *unaff_retaddr;
  QLCDNumber *q;
  ControlType type;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffffd8;
  SegmentStyle s;
  QLCDNumber *this_00;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  long lVar3;
  
  s = (SegmentStyle)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(this);
  uVar2 = 1;
  this_00 = pQVar1;
  ::operator|((Shape)((ulong)pQVar1 >> 0x20),(Shadow)pQVar1);
  type = (ControlType)((ulong)pQVar1 >> 0x20);
  QFrame::setFrameStyle
            ((QFrame *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),(int)((ulong)this >> 0x20));
  this->val = 0.0;
  this->field_0x288 = (this->field_0x288 & 0xfc) + 1;
  this->field_0x288 = this->field_0x288 & 0xfb;
  QLCDNumber::setDigitCount(unaff_retaddr,(int)((ulong)lVar3 >> 0x20));
  QLCDNumber::setSegmentStyle(this_00,s);
  policy.data = (quint32)((ulong)this_00 >> 0x20);
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),(Policy)((ulong)this >> 0x20),
             (Policy)this,type);
  QWidget::setSizePolicy((QWidget *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),(QSizePolicy)policy);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QLCDNumberPrivate::init()
{
    Q_Q(QLCDNumber);

    q->setFrameStyle(QFrame::Box | QFrame::Raised);
    val        = 0;
    base       = QLCDNumber::Dec;
    smallPoint = false;
    q->setDigitCount(ndigits);
    q->setSegmentStyle(QLCDNumber::Filled);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Minimum));
}